

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode setup_range(Curl_easy *data)

{
  undefined1 *puVar1;
  long lVar2;
  char *pcVar3;
  uint uVar4;
  
  lVar2 = (data->set).set_resume_from;
  (data->state).resume_from = lVar2;
  if ((lVar2 == 0) && ((data->set).str[0x28] == (char *)0x0)) {
    puVar1 = &(data->state).field_0x745;
    *puVar1 = *puVar1 & 0xfe;
  }
  else {
    if (((data->state).field_0x745 & 2) != 0) {
      (*Curl_cfree)((data->state).range);
    }
    if ((data->state).resume_from == 0) {
      pcVar3 = (*Curl_cstrdup)((data->set).str[0x28]);
    }
    else {
      pcVar3 = curl_maprintf("%ld-");
    }
    uVar4 = *(uint *)&(data->state).field_0x744 & 0xfffffdff | (uint)(pcVar3 != (char *)0x0) << 9;
    (data->state).range = pcVar3;
    *(uint *)&(data->state).field_0x744 = uVar4;
    if (pcVar3 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    *(uint *)&(data->state).field_0x744 = uVar4 | 0x100;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode setup_range(struct Curl_easy *data)
{
  struct UrlState *s = &data->state;
  s->resume_from = data->set.set_resume_from;
  if(s->resume_from || data->set.str[STRING_SET_RANGE]) {
    if(s->rangestringalloc)
      free(s->range);

    if(s->resume_from)
      s->range = aprintf("%" FMT_OFF_T "-", s->resume_from);
    else
      s->range = strdup(data->set.str[STRING_SET_RANGE]);

    s->rangestringalloc = (s->range) ? TRUE : FALSE;

    if(!s->range)
      return CURLE_OUT_OF_MEMORY;

    /* tell ourselves to fetch this range */
    s->use_range = TRUE;        /* enable range download */
  }
  else
    s->use_range = FALSE; /* disable range download */

  return CURLE_OK;
}